

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_pickups.cpp
# Opt level: O1

bool __thiscall AInventory::CallTryPickup(AInventory *this,AActor *toucher,AActor **toucher_return)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  AInventory *pAVar5;
  long lVar6;
  AInventory *pAVar7;
  AInventory *pAVar8;
  AActor *local_28;
  
  if (((toucher->flags).Value & 0x10000000) == 0) {
    pAVar7 = (this->super_AActor).Inventory.field_0.p;
    local_28 = toucher;
    bVar1 = CanPickup(this,toucher);
    lVar6 = 0x208;
    if ((bVar1) || (lVar6 = 0x210, (this->ItemFlags & 0x80000) == 0)) {
      cVar2 = (**(code **)((long)(this->super_AActor).super_DThinker.super_DObject._vptr_DObject +
                          lVar6))(this,&local_28);
      if (toucher_return != (AActor **)0x0) {
        *toucher_return = local_28;
      }
      if (((cVar2 == '\0') && ((this->ItemFlags & 0x400) != 0)) &&
         (iVar4 = (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x27])(this),
         (char)iVar4 == '\0')) {
        (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x36])(this);
        cVar2 = '\x01';
      }
      if (cVar2 == '\0') {
        return false;
      }
      GiveQuest(this,local_28);
      if ((this->ItemFlags & 0x1000000) == 0) {
        return (bool)cVar2;
      }
      while( true ) {
        pAVar8 = pAVar7;
        if (pAVar7 == (AInventory *)0x0) {
          bVar3 = 1;
        }
        else {
          bVar3 = ((byte)(pAVar7->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) >>
                  5;
          if (bVar3 != 0) {
            pAVar8 = (AInventory *)0x0;
          }
        }
        if (bVar3 != 0) break;
        if ((pAVar8 != (AInventory *)0x0) &&
           (((pAVar8->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
          pAVar8 = (AInventory *)0x0;
        }
        pAVar5 = (AInventory *)(pAVar8->Owner).field_0.p;
        if ((pAVar5 != (AInventory *)0x0) &&
           (((pAVar5->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
          (pAVar8->Owner).field_0.p = (AActor *)0x0;
          pAVar5 = (AInventory *)0x0;
        }
        pAVar7 = (pAVar8->super_AActor).Inventory.field_0.p;
        if ((pAVar5 == this) && (bVar1 = CallTryPickup(pAVar8,local_28,(AActor **)0x0), !bVar1)) {
          (*(pAVar8->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar8);
        }
      }
      return (bool)cVar2;
    }
  }
  return false;
}

Assistant:

bool AInventory::CallTryPickup (AActor *toucher, AActor **toucher_return)
{
	TObjPtr<AInventory> Invstack = Inventory; // A pointer of the inventories item stack.

	// unmorphed versions of a currently morphed actor cannot pick up anything. 
	if (toucher->flags & MF_UNMORPHED) return false;

	bool res;
	if (CanPickup(toucher))
		res = TryPickup(toucher);
	else if (!(ItemFlags & IF_RESTRICTABSOLUTELY))
		res = TryPickupRestricted(toucher);	// let an item decide for itself how it will handle this
	else
		return false;

	// Morph items can change the toucher so we need an option to return this info.
	if (toucher_return != NULL) *toucher_return = toucher;

	if (!res && (ItemFlags & IF_ALWAYSPICKUP) && !ShouldStay())
	{
		res = true;
		GoAwayAndDie();
	}

	if (res)
	{
		GiveQuest(toucher);

		// Transfer all inventory accross that the old object had, if requested.
		if ((ItemFlags & IF_TRANSFER))
		{
			while (Invstack)
			{
				AInventory* titem = Invstack;
				Invstack = titem->Inventory;
				if (titem->Owner == this)
				{
					if (!titem->CallTryPickup(toucher)) // The object no longer can exist
					{
						titem->Destroy();
					}
				}
			}
		}
	}
	return res;
}